

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparate
          (BlendMaskStateMachine *this,GLenum rgb,GLenum a)

{
  size_type sVar1;
  reference pvVar2;
  uint local_1c;
  uint i;
  GLenum a_local;
  GLenum rgb_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->blendEquationSeparate)(rgb,a);
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::size(&this->state);
    if (sVar1 <= local_1c) break;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_1c);
    pvVar2->mode_rgb = rgb;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_1c);
    pvVar2->mode_a = a;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquationSeparate(glw::GLenum rgb, glw::GLenum a)
{
	// all draw buffers
	gl.blendEquationSeparate(rgb, a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mode_rgb = rgb;
		state[i].mode_a   = a;
	}
}